

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILPSolver.cpp
# Opt level: O3

void __thiscall CILPSolver::PrepareSolutionBuffer(CILPSolver *this,int iNumSolution)

{
  double *pdVar1;
  ulong uVar2;
  
  if (this->m_iNumSolution < iNumSolution) {
    if (this->m_pSolution != (double *)0x0) {
      operator_delete__(this->m_pSolution);
      this->m_pSolution = (double *)0x0;
    }
    this->m_iNumSolution = iNumSolution;
    uVar2 = 0xffffffffffffffff;
    if (-2 < iNumSolution) {
      uVar2 = (ulong)(iNumSolution + 1) << 3;
    }
    pdVar1 = (double *)operator_new__(uVar2);
    this->m_pSolution = pdVar1;
  }
  return;
}

Assistant:

void CILPSolver::PrepareSolutionBuffer(int iNumSolution)
{
	if(iNumSolution>m_iNumSolution)
	{
#define SAFE_DELA(p)				{if(p) {delete[] p; p=NULL;}}
		SAFE_DELA(m_pSolution);

		m_iNumSolution	=	iNumSolution;
		m_pSolution		=	new	double[m_iNumSolution+1];

		assert(m_pSolution);

#ifdef _DEBUG
		m_pSolution[0]					=	-99;
		m_pSolution[m_iNumSolution]		=	-99;
#endif
	}
}